

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O1

void Diligent::ProcessUBVariable(ShaderCodeVariableDescX *Var,Uint32 BaseOffset)

{
  Uint32 *pUVar1;
  pointer pSVar2;
  pointer pSVar3;
  uint uVar4;
  ulong uVar5;
  char (*Args_1) [25];
  __normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
  __i;
  pointer pSVar6;
  long lVar7;
  string msg;
  string local_48;
  
  pSVar2 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar3) {
    uVar5 = (long)pSVar3 - (long)pSVar2 >> 7;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::operator()(pSVar2,pSVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar3 - (long)pSVar2 < 0x801) {
      std::operator()(pSVar2,pSVar3);
    }
    else {
      pSVar6 = pSVar2 + 0x10;
      std::operator()(pSVar2,pSVar6);
      for (; pSVar6 != pSVar3; pSVar6 = pSVar6 + 1) {
        std::operator()(pSVar6);
      }
    }
  }
  pSVar2 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (Var->super_ShaderCodeVariableDesc).pMembers = &pSVar2->super_ShaderCodeVariableDesc;
  Args_1 = (char (*) [25])
           ((long)(Var->Members).
                  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 7);
  local_48._M_dataplus._M_p = (pointer)Args_1;
  uVar4 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_48);
  (Var->super_ShaderCodeVariableDesc).NumMembers = uVar4;
  if (uVar4 != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      ProcessUBVariable((ShaderCodeVariableDescX *)
                        ((long)&(((Var->Members).
                                  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_ShaderCodeVariableDesc).Name + lVar7),
                        (Var->super_ShaderCodeVariableDesc).Offset);
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x80;
    } while (uVar5 < (Var->super_ShaderCodeVariableDesc).NumMembers);
  }
  if ((Var->super_ShaderCodeVariableDesc).Offset < BaseOffset) {
    FormatString<char[26],char[25]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Var.Offset >= BaseOffset",Args_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ProcessUBVariable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(Var->super_ShaderCodeVariableDesc).Offset;
  *pUVar1 = *pUVar1 - BaseOffset;
  return;
}

Assistant:

static void ProcessUBVariable(ShaderCodeVariableDescX& Var, Uint32 BaseOffset)
{
    // Re-sort by offset
    Var.ProcessMembers(
        [](auto& Members) {
            std::sort(Members.begin(), Members.end(),
                      [](const ShaderCodeVariableDescX& Var1, const ShaderCodeVariableDescX& Var2) {
                          return Var1.Offset < Var2.Offset;
                      });
        });

    for (Uint32 i = 0; i < Var.NumMembers; ++i)
    {
        auto& Member = Var.GetMember(i);
        ProcessUBVariable(Member, Var.Offset);
    }
    VERIFY_EXPR(Var.Offset >= BaseOffset);
    // Convert global offset to relative
    Var.Offset -= BaseOffset;
}